

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

void xmlDebugDumpString(FILE *output,xmlChar *str)

{
  int local_1c;
  int i;
  xmlChar *str_local;
  FILE *output_local;
  
  str_local = (xmlChar *)output;
  if (output == (FILE *)0x0) {
    str_local = _stdout;
  }
  if (str == (xmlChar *)0x0) {
    fprintf((FILE *)str_local,"(NULL)");
  }
  else {
    for (local_1c = 0; local_1c < 0x28; local_1c = local_1c + 1) {
      if (str[local_1c] == '\0') {
        return;
      }
      if ((str[local_1c] == ' ') ||
         (((8 < str[local_1c] && (str[local_1c] < 0xb)) || (str[local_1c] == '\r')))) {
        fputc(0x20,(FILE *)str_local);
      }
      else if (str[local_1c] < 0x80) {
        fputc((uint)str[local_1c],(FILE *)str_local);
      }
      else {
        fprintf((FILE *)str_local,"#%X",(ulong)str[local_1c]);
      }
    }
    fprintf((FILE *)str_local,"...");
  }
  return;
}

Assistant:

void
xmlDebugDumpString(FILE * output, const xmlChar * str)
{
    int i;

    if (output == NULL)
	output = stdout;
    if (str == NULL) {
        fprintf(output, "(NULL)");
        return;
    }
    for (i = 0; i < 40; i++)
        if (str[i] == 0)
            return;
        else if (IS_BLANK_CH(str[i]))
            fputc(' ', output);
        else if (str[i] >= 0x80)
            fprintf(output, "#%X", str[i]);
        else
            fputc(str[i], output);
    fprintf(output, "...");
}